

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::GatherAlongAxisLayerParams::CopyFrom
          (GatherAlongAxisLayerParams *this,GatherAlongAxisLayerParams *from)

{
  if (from != this) {
    Clear(this);
    MergeFrom(this,from);
    return;
  }
  return;
}

Assistant:

void GatherAlongAxisLayerParams::CopyFrom(const GatherAlongAxisLayerParams& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.GatherAlongAxisLayerParams)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}